

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktSpvAsmInstructionTests.cpp
# Opt level: O2

bool vkt::SpirVAssembly::passthruVerify
               (vector<de::SharedPtr<vkt::SpirVAssembly::BufferInterface>,_std::allocator<de::SharedPtr<vkt::SpirVAssembly::BufferInterface>_>_>
                *param_1,
               vector<de::SharedPtr<vk::Allocation>,_std::allocator<de::SharedPtr<vk::Allocation>_>_>
               *outputAllocs,
               vector<de::SharedPtr<vkt::SpirVAssembly::BufferInterface>,_std::allocator<de::SharedPtr<vkt::SpirVAssembly::BufferInterface>_>_>
               *expectedOutputs,TestLog *param_4)

{
  size_type __n;
  long lVar1;
  size_t outputNdx;
  ulong uVar2;
  vector<char,_std::allocator<char>_> data;
  allocator_type local_49;
  _Vector_base<char,_std::allocator<char>_> local_48;
  
  lVar1 = 0;
  for (uVar2 = 0;
      uVar2 < (ulong)((long)(outputAllocs->
                            super__Vector_base<de::SharedPtr<vk::Allocation>,_std::allocator<de::SharedPtr<vk::Allocation>_>_>
                            )._M_impl.super__Vector_impl_data._M_finish -
                      (long)(outputAllocs->
                            super__Vector_base<de::SharedPtr<vk::Allocation>,_std::allocator<de::SharedPtr<vk::Allocation>_>_>
                            )._M_impl.super__Vector_impl_data._M_start >> 4); uVar2 = uVar2 + 1) {
    __n = (**(code **)(**(long **)((long)&((expectedOutputs->
                                           super__Vector_base<de::SharedPtr<vkt::SpirVAssembly::BufferInterface>,_std::allocator<de::SharedPtr<vkt::SpirVAssembly::BufferInterface>_>_>
                                           )._M_impl.super__Vector_impl_data._M_start)->m_ptr +
                                  lVar1) + 0x10))();
    std::vector<char,_std::allocator<char>_>::vector
              ((vector<char,_std::allocator<char>_> *)&local_48,__n,&local_49);
    memcpy(local_48._M_impl.super__Vector_impl_data._M_start,
           *(void **)(*(long *)((long)&((outputAllocs->
                                        super__Vector_base<de::SharedPtr<vk::Allocation>,_std::allocator<de::SharedPtr<vk::Allocation>_>_>
                                        )._M_impl.super__Vector_impl_data._M_start)->m_ptr + lVar1)
                     + 0x18),__n);
    std::_Vector_base<char,_std::allocator<char>_>::~_Vector_base(&local_48);
    lVar1 = lVar1 + 0x10;
  }
  return true;
}

Assistant:

bool passthruVerify (const std::vector<BufferSp>&, const vector<AllocationSp>& outputAllocs, const std::vector<BufferSp>& expectedOutputs, TestLog&)
{
	DE_ASSERT(outputAllocs.size() != 0);
	DE_ASSERT(outputAllocs.size() == expectedOutputs.size());

	// Copy and discard the result.
	for (size_t outputNdx = 0; outputNdx < outputAllocs.size(); ++outputNdx)
	{
		size_t width = expectedOutputs[outputNdx]->getNumBytes();

		vector<char> data(width);
		memcpy(&data[0], outputAllocs[outputNdx]->getHostPtr(), width);
	}
	return true;
}